

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int read_CE(archive_read *a,iso9660 *iso9660)

{
  ulong uVar1;
  file_info *pfVar2;
  uchar *p_00;
  uchar *end_00;
  archive_read *in_RSI;
  archive *in_RDI;
  int r;
  size_t step;
  file_info *file;
  uchar *end;
  uchar *p;
  uchar *b;
  read_ce_queue *heap;
  size_t in_stack_ffffffffffffffa8;
  ushort in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 uVar3;
  int in_stack_ffffffffffffffb4;
  file_info *file_00;
  
  file_00 = (file_info *)&(in_RSI->archive).error;
  uVar1 = in_RSI->read_data_remaining;
  do {
    uVar3 = false;
    if (*(int *)&file_00->parent != 0) {
      uVar3 = file_00->use_next->use_next == (file_info *)in_RSI->read_data_output_offset;
    }
    if ((bool)uVar3 == false) {
      return 0;
    }
    p_00 = (uchar *)__archive_read_ahead
                              ((archive_read *)
                               CONCAT44(in_stack_ffffffffffffffb4,
                                        CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffffb2,
                                                                in_stack_ffffffffffffffb0))),
                               in_stack_ffffffffffffffa8,(ssize_t *)0x13b32c);
    if (p_00 == (uchar *)0x0) {
      archive_set_error(in_RDI,-1,"Failed to read full block when scanning ISO9660 directory list");
      return -0x1e;
    }
    do {
      pfVar2 = file_00->use_next->parent;
      if (uVar1 < pfVar2->ce_offset + pfVar2->ce_size) {
        archive_set_error(in_RDI,0x54,"Malformed CE information");
        return -0x1e;
      }
      end_00 = p_00 + pfVar2->ce_offset;
      next_CE((read_ce_queue *)file_00);
      in_stack_ffffffffffffffb4 = parse_rockridge(in_RSI,file_00,p_00,end_00);
      if (in_stack_ffffffffffffffb4 != 0) {
        return -0x1e;
      }
      in_stack_ffffffffffffffb2 = false;
      if (*(int *)&file_00->parent != 0) {
        in_stack_ffffffffffffffb2 =
             file_00->use_next->use_next == (file_info *)in_RSI->read_data_output_offset;
      }
    } while ((bool)in_stack_ffffffffffffffb2 != false);
    __archive_read_consume
              ((archive_read *)(ulong)CONCAT13(uVar3,(uint3)in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    in_RSI->read_data_output_offset = uVar1 + in_RSI->read_data_output_offset;
  } while( true );
}

Assistant:

static int
read_CE(struct archive_read *a, struct iso9660 *iso9660)
{
	struct read_ce_queue *heap;
	const unsigned char *b, *p, *end;
	struct file_info *file;
	size_t step;
	int r;

	/* Read data which RRIP "CE" extension points. */
	heap = &(iso9660->read_ce_req);
	step = iso9660->logical_block_size;
	while (heap->cnt &&
	    heap->reqs[0].offset == iso9660->current_position) {
		b = __archive_read_ahead(a, step, NULL);
		if (b == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Failed to read full block when scanning "
			    "ISO9660 directory list");
			return (ARCHIVE_FATAL);
		}
		do {
			file = heap->reqs[0].file;
			if (file->ce_offset + file->ce_size > step) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Malformed CE information");
				return (ARCHIVE_FATAL);
			}
			p = b + file->ce_offset;
			end = p + file->ce_size;
			next_CE(heap);
			r = parse_rockridge(a, file, p, end);
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} while (heap->cnt &&
		    heap->reqs[0].offset == iso9660->current_position);
		/* NOTE: Do not move this consume's code to fron of
		 * do-while loop. Registration of nested CE extension
		 * might cause error because of current position. */
		__archive_read_consume(a, step);
		iso9660->current_position += step;
	}
	return (ARCHIVE_OK);
}